

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_CodeAuthenticator.cpp
# Opt level: O0

bool __thiscall axl::sys::CodeAuthenticator::verifyFile(CodeAuthenticator *this,StringRef *fileName)

{
  undefined1 uVar1;
  uint uVar2;
  char *in_RSI;
  undefined8 in_RDI;
  bool result;
  Block signatureSection;
  uchar_t hash [20];
  SimpleMappedFile file;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  SimpleMappedFile *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  bool bVar3;
  undefined1 in_stack_ffffffffffffff17;
  int type;
  Rsa *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  ErrorRef *in_stack_ffffffffffffff30;
  long local_98;
  Block *in_stack_ffffffffffffffb8;
  uchar_t *in_stack_ffffffffffffffc0;
  BufHdr *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  ElfHashGenerator *in_stack_ffffffffffffffd8;
  bool local_1;
  
  type = (int)((ulong)in_RDI >> 0x20);
  io::SimpleMappedFile::SimpleMappedFile
            ((SimpleMappedFile *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  mem::Block::Block((Block *)0x14bbbb);
  uVar2 = io::SimpleMappedFile::open((SimpleMappedFile *)&stack0xffffffffffffff90,in_RSI,1);
  uVar1 = (undefined1)uVar2;
  bVar3 = false;
  if ((uVar2 & 1) != 0) {
    in_stack_ffffffffffffff08 = io::SimpleMappedFile::p((SimpleMappedFile *)0x14bbfb);
    in_stack_ffffffffffffff00 =
         (SimpleMappedFile *)io::SimpleMappedFile::getMappingSize((SimpleMappedFile *)0x14bc0f);
    in_stack_fffffffffffffeff =
         lnx::ElfHashGenerator::generateHash
                   (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
    bVar3 = (bool)in_stack_fffffffffffffeff;
  }
  if (bVar3 == false) {
    local_1 = false;
  }
  else if (local_98 == 0) {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_1 = err::fail((ErrorRef *)0x14bca5);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x14bcc2);
  }
  else {
    bVar3 = cry::Rsa::verifyHash
                      (in_stack_ffffffffffffff20,type,
                       (void *)CONCAT17(uVar1,CONCAT16(bVar3,in_stack_ffffffffffffff10)),
                       (size_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,
                                         CONCAT15(in_stack_fffffffffffffefd,
                                                  CONCAT14(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8)))));
    if (bVar3) {
      local_1 = true;
    }
    else {
      err::ErrorRef::ErrorRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_1 = err::fail((ErrorRef *)0x14bd4a);
      err::ErrorRef::~ErrorRef((ErrorRef *)0x14bd67);
    }
  }
  io::SimpleMappedFile::~SimpleMappedFile(in_stack_ffffffffffffff00);
  return local_1;
}

Assistant:

bool
CodeAuthenticator::verifyFile(const sl::StringRef& fileName) {
	io::SimpleMappedFile file;
	uchar_t hash[SHA_DIGEST_LENGTH];
	mem::Block signatureSection;

	bool result =
		file.open(fileName, io::FileFlag_ReadOnly) &&
		generateHash(file.p(), file.getMappingSize(), hash, &signatureSection);

	if (!result)
		return false;

	if (!signatureSection.m_p)
		return err::fail("ELF-file signature not found");

	result = m_publicKey.verifyHash(
		NID_sha1,
		hash,
		sizeof(hash),
		signatureSection.m_p,
		signatureSection.m_size
	);

	if (!result)
		return err::fail("ELF-file signature mismatch");

	return true;
}